

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O3

ssize_t __thiscall r_comp::ObjectMap::read(ObjectMap *this,int __fd,void *__buf,size_t __nbytes)

{
  iterator __position;
  ulong in_RAX;
  ulong extraout_RAX;
  undefined4 in_register_00000034;
  void *pvVar1;
  uint local_2c;
  
  if (__buf != (void *)0x0) {
    pvVar1 = (void *)0x0;
    do {
      local_2c = *(uint *)(CONCAT44(in_register_00000034,__fd) + (long)pvVar1 * 4);
      in_RAX = (ulong)local_2c;
      __position._M_current =
           (this->objects).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->objects).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,__position,&local_2c);
        in_RAX = extraout_RAX;
      }
      else {
        *__position._M_current = local_2c;
        (this->objects).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pvVar1 = (void *)((long)pvVar1 + 1);
    } while (__buf != pvVar1);
  }
  return in_RAX;
}

Assistant:

void ObjectMap::read(uint32_t *data, size_t size)
{
    for (size_t i = 0; i < size; ++i) {
        objects.push_back(data[i]);
    }
}